

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_bitwrite.c
# Opt level: O0

void mpp_writer_put_ue(MppWriteCtx *ctx,RK_U32 val)

{
  byte bVar1;
  uint uVar2;
  undefined4 local_1c;
  undefined4 local_18;
  RK_U32 tmp;
  RK_U32 num_bits;
  RK_U32 val_local;
  MppWriteCtx *ctx_local;
  
  local_18 = 0;
  tmp = val + 1;
  uVar2 = local_18;
  do {
    local_18 = uVar2;
    uVar2 = local_18 + 1;
  } while (tmp >> ((byte)uVar2 & 0x1f) != 0);
  if (uVar2 < 0xd) {
    mpp_writer_put_bits(ctx,tmp,uVar2 * 2 + -1);
  }
  else {
    local_1c = local_18;
    if (0x18 < local_18) {
      local_1c = local_18 - 0x18;
      mpp_writer_put_bits(ctx,0,0x18);
    }
    mpp_writer_put_bits(ctx,0,local_1c);
    if (0x18 < uVar2) {
      bVar1 = (byte)(local_18 - 0x17);
      mpp_writer_put_bits(ctx,tmp >> (bVar1 & 0x1f),0x18);
      tmp = tmp >> (bVar1 & 0x1f);
      uVar2 = local_18 - 0x17;
    }
    local_18 = uVar2;
    mpp_writer_put_bits(ctx,tmp,local_18);
  }
  return;
}

Assistant:

void mpp_writer_put_ue(MppWriteCtx *ctx, RK_U32 val)
{
    RK_U32 num_bits = 0;

    val++;
    while (val >> ++num_bits);

    if (num_bits > 12) {
        RK_U32 tmp;

        tmp = num_bits - 1;

        if (tmp > 24) {
            tmp -= 24;
            mpp_writer_put_bits(ctx, 0, 24);
        }

        mpp_writer_put_bits(ctx, 0, tmp);

        if (num_bits > 24) {
            num_bits -= 24;
            mpp_writer_put_bits(ctx, val >> num_bits, 24);
            val = val >> num_bits;
        }

        mpp_writer_put_bits(ctx, val, num_bits);
    } else {
        mpp_writer_put_bits(ctx, val, 2 * num_bits - 1);
    }
}